

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_SetPitch
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  void *pvVar1;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  AActor *pAVar5;
  char *pcVar6;
  uint uVar7;
  bool bVar8;
  DAngle local_30;
  PClass *pPVar4;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_003da6c8;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003da6b8:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003da6c8:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1275,
                  "int AF_AActor_A_SetPitch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  pAVar5 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar5 == (AActor *)0x0) goto LAB_003da60a;
    pPVar4 = (pAVar5->super_DThinker).super_DObject.Class;
    if (pPVar4 == (PClass *)0x0) {
      iVar3 = (**(pAVar5->super_DThinker).super_DObject._vptr_DObject)(pAVar5);
      pPVar4 = (PClass *)CONCAT44(extraout_var,iVar3);
      (pAVar5->super_DThinker).super_DObject.Class = pPVar4;
    }
    bVar8 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar2 && bVar8) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar8 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar2) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (!bVar8) {
      pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003da6c8;
    }
  }
  else {
    if (pAVar5 != (AActor *)0x0) goto LAB_003da6b8;
LAB_003da60a:
    pAVar5 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar6 = "(paramnum) < numparam";
LAB_003da6f0:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1276,
                  "int AF_AActor_A_SetPitch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\x01') {
    pcVar6 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_003da6f0;
  }
  pvVar1 = param[1].field_0.field_1.a;
  if (numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003da718;
    }
    uVar7 = param[2].field_0.i;
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar6 = "(param[paramnum]).Type == REGT_INT";
LAB_003da718:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1277,
                    "int AF_AActor_A_SetPitch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    uVar7 = param[2].field_0.i;
    if (numparam != 3) {
      if (param[3].field_0.field_3.Type == '\0') goto LAB_003da674;
      pcVar6 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003da737;
    }
    param = defaultparam->Array;
  }
  if (param[3].field_0.field_3.Type == '\0') {
LAB_003da674:
    pAVar5 = COPY_AAPTR(pAVar5,param[3].field_0.i);
    if (pAVar5 != (AActor *)0x0) {
      local_30.Degrees = (double)pvVar1;
      AActor::SetPitch(pAVar5,&local_30,SUB41((uVar7 & 2) >> 1,0),(bool)((byte)uVar7 & 1));
    }
    return 0;
  }
  pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003da737:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1278,
                "int AF_AActor_A_SetPitch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetPitch)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(pitch);
	PARAM_INT_DEF(flags);
	PARAM_INT_DEF(ptr);

	AActor *ref = COPY_AAPTR(self, ptr);

	if (ref != NULL)
	{
		ref->SetPitch(pitch, !!(flags & SPF_INTERPOLATE), !!(flags & SPF_FORCECLAMP));
	}
	return 0;
}